

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cc
# Opt level: O1

bool __thiscall tcmalloc::Sampler::RecordAllocationSlow(Sampler *this,size_t k)

{
  int iVar1;
  ulong uVar2;
  ssize_t sVar3;
  Sampler *pSVar4;
  
  if (this->initialized_ == false) {
    this->initialized_ = true;
    this->rnd_ = (uint64_t)this;
    iVar1 = 0x14;
    pSVar4 = this;
    do {
      pSVar4 = (Sampler *)((long)pSVar4 * 0x5deece66d + 0xbU & 0xffffffffffff);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    this->rnd_ = (uint64_t)pSVar4;
    uVar2 = PickNextSamplingPoint(this);
    this->bytes_until_sample_ = uVar2;
    if (k <= uVar2) {
      this->bytes_until_sample_ = uVar2 - k;
      return true;
    }
  }
  sVar3 = PickNextSamplingPoint(this);
  this->bytes_until_sample_ = sVar3;
  return FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
         FLAGS_tcmalloc_sample_parameter < 1;
}

Assistant:

bool Sampler::RecordAllocationSlow(size_t k) {
  if (!initialized_) {
    initialized_ = true;
    Init(reinterpret_cast<uintptr_t>(this));
    if (static_cast<size_t>(bytes_until_sample_) >= k) {
      bytes_until_sample_ -= k;
      return true;
    }
  }
  bytes_until_sample_ = PickNextSamplingPoint();
  return FLAGS_tcmalloc_sample_parameter <= 0;
}